

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChHexahedronFace.h
# Opt level: O2

bool __thiscall chrono::fea::ChHexahedronFace::IsSubBlockActive(ChHexahedronFace *this,int nblock)

{
  byte bVar1;
  undefined1 local_18 [16];
  
  GetNodeN((ChHexahedronFace *)local_18,(int)this);
  bVar1 = (**(code **)(*(long *)local_18._0_8_ + 0x18))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_18 + 8));
  return (bool)(bVar1 ^ 1);
}

Assistant:

virtual bool IsSubBlockActive(int nblock) const override { return !GetNodeN(nblock)->GetFixed(); }